

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_InitializedAsNull_Test::TestBody
          (StatePointer_InitializedAsNull_Test *this)

{
  bool bVar1;
  char *pcVar2;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *this_00;
  state_type in_RDX;
  state_type state;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> local_50;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> bar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> foo;
  AssertionResult gtest_ar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> local_28;
  
  this_00 = &bar;
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (this_00,(nullptr_t)0x0,in_RDX);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&local_50,(nullptr_t)0x0,state);
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ("foo","bar",this_00,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&foo);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&foo);
    local_28.m_ptr_and_state = 0;
    testing::internal::EqHelper<false>::
    Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,decltype(nullptr)>
              ((char *)&foo,(char *)&bar,&local_28,(void **)this_00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&foo);
    if (bVar1) goto LAB_00120815;
    testing::Message::Message((Message *)&local_28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&foo);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_28);
  }
  else {
    testing::Message::Message((Message *)&local_28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&foo);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_28);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message((Message *)&local_28);
LAB_00120815:
  testing::AssertionResult::~AssertionResult((AssertionResult *)&foo);
  return;
}

Assistant:

TEST(StatePointer, InitializedAsNull) {
	state_ptr<Foo> foo{nullptr, 0};
	state_ptr<Foo> bar{nullptr, 0};
	ASSERT_EQ(foo, bar);
	ASSERT_EQ(foo, nullptr);
}